

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaANCF_3843::Calc_Sxi_eta_compact
          (ChElementHexaANCF_3843 *this,VectorN *Sxi_eta_compact,double xi,double eta,double zeta)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar24 [64];
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  auVar24._8_56_ = in_register_00001288;
  auVar24._0_8_ = zeta;
  auVar21._8_56_ = in_register_00001248;
  auVar21._0_8_ = eta;
  auVar19._8_56_ = in_register_00001208;
  auVar19._0_8_ = xi;
  auVar22 = auVar24._0_16_;
  auVar6 = vaddsd_avx512f(auVar22,ZEXT816(0xbff0000000000000));
  auVar7 = vaddsd_avx512f(auVar19._0_16_,ZEXT816(0xbff0000000000000));
  auVar20 = auVar21._0_16_;
  auVar8 = vfmadd213sd_avx512f(ZEXT816(0x4008000000000000),auVar20,ZEXT816(0x3ff0000000000000));
  auVar9 = vaddsd_avx512f(auVar20,ZEXT816(0xbff0000000000000));
  auVar10 = vfmadd213sd_avx512f(ZEXT816(0x4008000000000000),auVar20,ZEXT816(0xbff0000000000000));
  auVar30._8_8_ = 0;
  auVar30._0_8_ = eta * 3.0;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = xi * xi;
  auVar14 = vfmadd231sd_fma(auVar39,auVar20,auVar30);
  dVar25 = auVar6._0_8_;
  auVar11 = vmulsd_avx512f(auVar6,ZEXT816(0xbfb0000000000000));
  dVar26 = auVar7._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = auVar14._0_8_ + xi;
  auVar4 = vfmadd231sd_fma(auVar38,auVar22,auVar22);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = auVar14._0_8_ - xi;
  auVar5 = vfmadd231sd_fma(auVar40,auVar22,auVar22);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = auVar4._0_8_ + zeta;
  auVar12 = vaddsd_avx512f(auVar31,ZEXT816(0xc008000000000000));
  auVar13 = vaddsd_avx512f(auVar19._0_16_,ZEXT816(0x3ff0000000000000));
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar25 * 0.0625 * dVar26;
  auVar14 = vmulsd_avx512f(auVar28,auVar12);
  auVar15 = vmulsd_avx512f(auVar13,auVar11);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = auVar5._0_8_ + zeta;
  auVar16 = vaddsd_avx512f(auVar18,ZEXT816(0xc008000000000000));
  dVar29 = auVar13._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0] = auVar14._0_8_;
  auVar17 = vmulsd_avx512f(auVar15,auVar16);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar25 * 0.0625 * dVar29;
  auVar18 = vmulsd_avx512f(auVar37,auVar16);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = this->m_lenX;
  auVar14 = vmulsd_avx512f(ZEXT816(0x3fa0000000000000),auVar14);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[1] = auVar14._0_8_ * dVar29 * dVar26 * dVar26 * dVar25;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = this->m_lenY;
  auVar14 = vmulsd_avx512f(ZEXT816(0x3fa0000000000000),auVar15);
  dVar34 = auVar8._0_8_;
  dVar35 = auVar9._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[2] = dVar35 * dVar34 * auVar14._0_8_ * dVar25 * dVar26;
  auVar14 = vaddsd_avx512f(auVar22,ZEXT816(0x3ff0000000000000));
  auVar16._8_8_ = 0;
  auVar16._0_8_ = this->m_lenZ;
  auVar23 = ZEXT816(0x3fa0000000000000);
  auVar15 = vmulsd_avx512f(auVar23,auVar16);
  auVar16 = vmulsd_avx512f(auVar14,ZEXT816(0xbfb0000000000000));
  dVar32 = auVar14._0_8_;
  auVar15 = vmulsd_avx512f(auVar14,auVar15);
  auVar15 = vmulsd_avx512f(auVar6,auVar15);
  auVar15 = vmulsd_avx512f(auVar6,auVar15);
  auVar15 = vmulsd_avx512f(auVar7,auVar15);
  pdVar1 = (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 3;
  vmovsd_avx512f(auVar15);
  *pdVar1 = *pdVar1;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[4] = auVar17._0_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = this->m_lenX;
  auVar15 = vmulsd_avx512f(auVar23,auVar17);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[5] = dVar25 * dVar29 * dVar29 * dVar26 * auVar15._0_8_;
  auVar17 = ZEXT816(0xbfa0000000000000);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = this->m_lenY;
  auVar15 = vmulsd_avx512f(auVar17,auVar22);
  auVar15 = vmulsd_avx512f(auVar8,auVar15);
  auVar15 = vmulsd_avx512f(auVar9,auVar15);
  auVar15 = vmulsd_avx512f(auVar6,auVar15);
  auVar15 = vmulsd_avx512f(auVar13,auVar15);
  pdVar1 = (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 6;
  vmovsd_avx512f(auVar15);
  *pdVar1 = *pdVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = this->m_lenZ;
  auVar15 = vmulsd_avx512f(auVar17,auVar8);
  auVar14 = vmulsd_avx512f(auVar14,auVar15);
  auVar14 = vmulsd_avx512f(auVar6,auVar14);
  auVar14 = vmulsd_avx512f(auVar6,auVar14);
  auVar14 = vmulsd_avx512f(auVar13,auVar14);
  pdVar1 = (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).
           m_storage.m_data.array + 7;
  vmovsd_avx512f(auVar14);
  *pdVar1 = *pdVar1;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[8] = auVar18._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[9] = this->m_lenX * -0.03125 * dVar26 * dVar29 * dVar29 * dVar25;
  auVar14 = vaddsd_avx512f(auVar20,ZEXT816(0x3ff0000000000000));
  auVar6._8_8_ = 0;
  auVar6._0_8_ = this->m_lenY;
  auVar15 = vmulsd_avx512f(auVar17,auVar6);
  auVar15 = vmulsd_avx512f(auVar14,auVar15);
  auVar15 = vmulsd_avx512f(auVar10,auVar15);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[10] = dVar29 * dVar25 * auVar15._0_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = this->m_lenZ;
  auVar15 = vmulsd_avx512f(auVar23,auVar9);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0xb] = dVar29 * dVar25 * dVar25 * dVar32 * auVar15._0_8_;
  auVar15 = vmulsd_avx512f(auVar7,auVar11);
  auVar15 = vmulsd_avx512f(auVar15,auVar12);
  auVar17 = vmulsd_avx512f(auVar7,auVar16);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0xc] = auVar15._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0xd] = dVar25 * dVar26 * dVar26 * dVar29 * this->m_lenX * -0.03125;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = this->m_lenY;
  auVar15 = vmulsd_avx512f(auVar23,auVar7);
  dVar36 = auVar14._0_8_;
  dVar27 = auVar10._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0xe] = dVar26 * dVar25 * dVar27 * dVar36 * auVar15._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0xf] = dVar26 * dVar25 * dVar25 * dVar32 * this->m_lenZ * -0.03125;
  dVar2 = (auVar4._0_8_ - zeta) + -3.0;
  dVar3 = (auVar5._0_8_ - zeta) + -3.0;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar2;
  auVar14 = vmulsd_avx512f(auVar17,auVar20);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar32 * 0.0625;
  auVar15 = vmulsd_avx512f(auVar13,auVar33);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x10] = auVar14._0_8_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar3;
  auVar14 = vmulsd_avx512f(auVar15,auVar23);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x11] = dVar32 * this->m_lenX * -0.03125 * dVar29 * dVar26 * dVar26;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x12] = dVar32 * dVar35 * dVar34 * this->m_lenY * -0.03125 * dVar26;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->m_lenZ;
  auVar17 = ZEXT816(0x3fa0000000000000);
  auVar15 = vmulsd_avx512f(auVar17,auVar4);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x13] = dVar32 * dVar32 * auVar15._0_8_ * dVar25 * dVar26;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x14] = auVar14._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x15] = dVar32 * this->m_lenX * -0.03125 * dVar26 * dVar29 * dVar29;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = this->m_lenY;
  auVar14 = vmulsd_avx512f(auVar17,auVar5);
  auVar15 = vmulsd_avx512f(auVar13,auVar16);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x16] = dVar32 * dVar35 * dVar34 * auVar14._0_8_ * dVar29;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x17] = dVar32 * dVar32 * this->m_lenZ * -0.03125 * dVar25 * dVar29;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x18] = auVar15._0_8_ * dVar3;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = this->m_lenX;
  auVar14 = vmulsd_avx512f(auVar17,auVar10);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x19] = dVar32 * dVar29 * dVar29 * dVar26 * auVar14._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = this->m_lenY;
  auVar14 = vmulsd_avx512f(auVar17,auVar11);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x1a] = dVar29 * dVar32 * dVar27 * dVar36 * auVar14._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = this->m_lenZ;
  auVar14 = vmulsd_avx512f(auVar17,auVar12);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x1b] = dVar29 * dVar32 * dVar32 * dVar25 * auVar14._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x1c] = dVar32 * 0.0625 * dVar26 * dVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = this->m_lenX;
  auVar14 = vmulsd_avx512f(auVar17,auVar13);
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x1d] = dVar32 * dVar26 * dVar26 * dVar29 * auVar14._0_8_;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x1e] = dVar26 * dVar32 * dVar27 * dVar36 * this->m_lenY * -0.03125;
  (Sxi_eta_compact->super_PlainObjectBase<Eigen::Matrix<double,_32,_1,_0,_32,_1>_>).m_storage.m_data
  .array[0x1f] = dVar26 * dVar32 * dVar32 * dVar25 * this->m_lenZ * -0.03125;
  return;
}

Assistant:

void ChElementHexaANCF_3843::Calc_Sxi_eta_compact(VectorN& Sxi_eta_compact, double xi, double eta, double zeta) {
    Sxi_eta_compact(0) = 0.0625 * (zeta - 1) * (xi - 1) * (3 * eta * eta + xi * xi + xi + zeta * zeta + zeta - 3);
    Sxi_eta_compact(1) = 0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta - 1);
    Sxi_eta_compact(2) = 0.03125 * m_lenY * (3 * eta + 1) * (eta - 1) * (zeta - 1) * (xi - 1);
    Sxi_eta_compact(3) = 0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi - 1);
    Sxi_eta_compact(4) = -0.0625 * (zeta - 1) * (xi + 1) * (3 * eta * eta + xi * xi - xi + zeta * zeta + zeta - 3);
    Sxi_eta_compact(5) = 0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta - 1);
    Sxi_eta_compact(6) = -0.03125 * m_lenY * (3 * eta + 1) * (eta - 1) * (zeta - 1) * (xi + 1);
    Sxi_eta_compact(7) = -0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi + 1);
    Sxi_eta_compact(8) = 0.0625 * (zeta - 1) * (xi + 1) * (3 * eta * eta + xi * xi - xi + zeta * zeta + zeta - 3);
    Sxi_eta_compact(9) = -0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta - 1);
    Sxi_eta_compact(10) = -0.03125 * m_lenY * (eta + 1) * (3 * eta - 1) * (zeta - 1) * (xi + 1);
    Sxi_eta_compact(11) = 0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi + 1);
    Sxi_eta_compact(12) = -0.0625 * (zeta - 1) * (xi - 1) * (3 * eta * eta + xi * xi + xi + zeta * zeta + zeta - 3);
    Sxi_eta_compact(13) = -0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta - 1);
    Sxi_eta_compact(14) = 0.03125 * m_lenY * (eta + 1) * (3 * eta - 1) * (zeta - 1) * (xi - 1);
    Sxi_eta_compact(15) = -0.03125 * m_lenZ * (zeta + 1) * (zeta - 1) * (zeta - 1) * (xi - 1);
    Sxi_eta_compact(16) = -0.0625 * (zeta + 1) * (xi - 1) * (3 * eta * eta + xi * xi + xi + zeta * zeta - zeta - 3);
    Sxi_eta_compact(17) = -0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta + 1);
    Sxi_eta_compact(18) = -0.03125 * m_lenY * (3 * eta + 1) * (eta - 1) * (zeta + 1) * (xi - 1);
    Sxi_eta_compact(19) = 0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi - 1);
    Sxi_eta_compact(20) = 0.0625 * (zeta + 1) * (xi + 1) * (3 * eta * eta + xi * xi - xi + zeta * zeta - zeta - 3);
    Sxi_eta_compact(21) = -0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta + 1);
    Sxi_eta_compact(22) = 0.03125 * m_lenY * (3 * eta + 1) * (eta - 1) * (zeta + 1) * (xi + 1);
    Sxi_eta_compact(23) = -0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi + 1);
    Sxi_eta_compact(24) = -0.0625 * (zeta + 1) * (xi + 1) * (3 * eta * eta + xi * xi - xi + zeta * zeta - zeta - 3);
    Sxi_eta_compact(25) = 0.03125 * m_lenX * (xi - 1) * (xi + 1) * (xi + 1) * (zeta + 1);
    Sxi_eta_compact(26) = 0.03125 * m_lenY * (eta + 1) * (3 * eta - 1) * (zeta + 1) * (xi + 1);
    Sxi_eta_compact(27) = 0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi + 1);
    Sxi_eta_compact(28) = 0.0625 * (zeta + 1) * (xi - 1) * (3 * eta * eta + xi * xi + xi + zeta * zeta - zeta - 3);
    Sxi_eta_compact(29) = 0.03125 * m_lenX * (xi + 1) * (xi - 1) * (xi - 1) * (zeta + 1);
    Sxi_eta_compact(30) = -0.03125 * m_lenY * (eta + 1) * (3 * eta - 1) * (zeta + 1) * (xi - 1);
    Sxi_eta_compact(31) = -0.03125 * m_lenZ * (zeta - 1) * (zeta + 1) * (zeta + 1) * (xi - 1);
}